

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Operation * __thiscall dxil_spv::SPIRVModule::allocate_op(SPIRVModule *this,Op op,Id id,Id type_id)

{
  pointer pIVar1;
  Operation *pOVar2;
  Id local_1c;
  Id local_18;
  Id type_id_local;
  Id id_local;
  Op op_local;
  SPIRVModule *this_local;
  
  local_1c = type_id;
  local_18 = id;
  type_id_local = op;
  _id_local = this;
  pIVar1 = std::
           unique_ptr<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
           ::operator->(&this->impl);
  pOVar2 = ScratchPool<dxil_spv::Operation>::allocate<spv::Op&,unsigned_int&,unsigned_int&>
                     (&pIVar1->operation_pool,&type_id_local,&local_18,&local_1c);
  return pOVar2;
}

Assistant:

Operation *SPIRVModule::allocate_op(spv::Op op, spv::Id id, spv::Id type_id)
{
	return impl->operation_pool.allocate(op, id, type_id);
}